

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O1

bool __thiscall ServerManager::freeServer(ServerManager *this,IRC_Bot *server)

{
  unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *puVar1;
  IRC_Bot *pIVar2;
  iterator __position;
  bool bVar3;
  
  __position._M_current =
       (this->m_servers).
       super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_servers).
           super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = __position._M_current != puVar1;
  if (bVar3) {
    pIVar2 = ((__position._M_current)->_M_t).
             super___uniq_ptr_impl<IRC_Bot,_std::default_delete<IRC_Bot>_>._M_t.
             super__Tuple_impl<0UL,_IRC_Bot_*,_std::default_delete<IRC_Bot>_>.
             super__Head_base<0UL,_IRC_Bot_*,_false>._M_head_impl;
    while (pIVar2 != server) {
      __position._M_current = __position._M_current + 1;
      bVar3 = __position._M_current != puVar1;
      if (__position._M_current == puVar1) {
        return bVar3;
      }
      pIVar2 = ((__position._M_current)->_M_t).
               super___uniq_ptr_impl<IRC_Bot,_std::default_delete<IRC_Bot>_>._M_t.
               super__Tuple_impl<0UL,_IRC_Bot_*,_std::default_delete<IRC_Bot>_>.
               super__Head_base<0UL,_IRC_Bot_*,_false>._M_head_impl;
    }
    std::
    vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
    ::_M_erase(&this->m_servers,__position);
  }
  return bVar3;
}

Assistant:

bool ServerManager::freeServer(IRC_Bot *server) {
	for (auto itr = m_servers.begin(); itr != m_servers.end(); ++itr) {
		if (itr->get() == server) {
			m_servers.erase(itr);
			return true;
		}
	}

	return false;
}